

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_dart.cpp
# Opt level: O0

void __thiscall
flatbuffers::dart::DartGenerator::GenStruct
          (DartGenerator *this,StructDef *struct_def,namespace_code_map *namespace_code)

{
  string *__return_storage_ptr__;
  bool bVar1;
  mapped_type *pmVar2;
  reference ppFVar3;
  difference_type dVar4;
  pair<int,_flatbuffers::FieldDef_*> pVar5;
  string local_458;
  string local_438;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  string local_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  FieldDef *local_398;
  value_type local_390;
  __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  local_380;
  int local_374;
  FieldDef *pFStack_370;
  int offset;
  FieldDef *field;
  __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  local_360;
  const_iterator it;
  vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
  non_deprecated_fields;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  undefined1 local_140 [8];
  string builder_code;
  string reader_code;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> object_builder_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> builder_name;
  undefined1 local_a0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> reader_name;
  string *struct_type;
  string local_48;
  string *local_28;
  string *code;
  namespace_code_map *namespace_code_local;
  StructDef *struct_def_local;
  DartGenerator *this_local;
  
  if (((struct_def->super_Definition).generated & 1U) == 0) {
    code = (string *)namespace_code;
    namespace_code_local = (namespace_code_map *)struct_def;
    struct_def_local = (StructDef *)this;
    IdlNamer::Namespace_abi_cxx11_
              (&local_48,&this->namer_,(struct_def->super_Definition).defined_namespace);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](namespace_code,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    __return_storage_ptr__ = (string *)(&reader_name.field_2._M_allocated_capacity + 1);
    local_28 = pmVar2;
    IdlNamer::Type_abi_cxx11_
              (__return_storage_ptr__,&this->namer_,(StructDef *)namespace_code_local);
    GenDocComment((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&namespace_code_local[1]._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
                  ,"",local_28);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&builder_name.field_2 + 8),"_",__return_storage_ptr__);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&builder_name.field_2 + 8),"Reader");
    std::__cxx11::string::~string((string *)(builder_name.field_2._M_local_buf + 8));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&object_builder_name.field_2 + 8),__return_storage_ptr__,"Builder");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&reader_code.field_2 + 8),__return_storage_ptr__,"ObjectBuilder");
    std::__cxx11::string::string((string *)(builder_code.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)local_140);
    std::operator+(&local_180,"class ",__return_storage_ptr__);
    std::operator+(&local_160,&local_180," {\n");
    std::__cxx11::string::operator+=((string *)local_28,(string *)&local_160);
    std::__cxx11::string::~string((string *)&local_160);
    std::__cxx11::string::~string((string *)&local_180);
    std::operator+(&local_1c0,"  ",__return_storage_ptr__);
    std::operator+(&local_1a0,&local_1c0,"._(this._bc, this._bcOffset);\n");
    std::__cxx11::string::operator+=((string *)local_28,(string *)&local_1a0);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::__cxx11::string::~string((string *)&local_1c0);
    if (((ulong)namespace_code_local[5]._M_t._M_impl.super__Rb_tree_header._M_header._M_right & 1)
        == 0) {
      std::operator+(&local_200,"  factory ",__return_storage_ptr__);
      std::operator+(&local_1e0,&local_200,"(List<int> bytes) {\n");
      std::__cxx11::string::operator+=((string *)local_28,(string *)&local_1e0);
      std::__cxx11::string::~string((string *)&local_1e0);
      std::__cxx11::string::~string((string *)&local_200);
      std::operator+(&local_240,"    final rootRef = ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     _kFb_abi_cxx11_);
      std::operator+(&local_220,&local_240,".BufferContext.fromBytes(bytes);\n");
      std::__cxx11::string::operator+=((string *)local_28,(string *)&local_220);
      std::__cxx11::string::~string((string *)&local_220);
      std::__cxx11::string::~string((string *)&local_240);
      std::__cxx11::string::operator+=((string *)local_28,"    return reader.read(rootRef, 0);\n");
      std::__cxx11::string::operator+=((string *)local_28,"  }\n");
    }
    std::__cxx11::string::operator+=((string *)local_28,"\n");
    std::operator+(&local_300,"  static const ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   _kFb_abi_cxx11_);
    std::operator+(&local_2e0,&local_300,".Reader<");
    std::operator+(&local_2c0,&local_2e0,__return_storage_ptr__);
    std::operator+(&local_2a0,&local_2c0,"> reader = ");
    std::operator+(&local_280,&local_2a0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
    std::operator+(&local_260,&local_280,"();\n\n");
    std::__cxx11::string::operator+=((string *)local_28,(string *)&local_260);
    std::__cxx11::string::~string((string *)&local_260);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::__cxx11::string::~string((string *)&local_2e0);
    std::__cxx11::string::~string((string *)&local_300);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &non_deprecated_fields.
                    super__Vector_base<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,"  final ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   _kFb_abi_cxx11_);
    std::operator+(&local_320,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &non_deprecated_fields.
                    super__Vector_base<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,".BufferContext _bc;\n");
    std::__cxx11::string::operator+=((string *)local_28,(string *)&local_320);
    std::__cxx11::string::~string((string *)&local_320);
    std::__cxx11::string::~string
              ((string *)
               &non_deprecated_fields.
                super__Vector_base<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::operator+=((string *)local_28,"  final int _bcOffset;\n\n");
    std::
    vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
    ::vector((vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
              *)&it);
    local_360._M_current =
         (FieldDef **)
         std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::begin
                   ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)
                    &namespace_code_local[5]._M_t._M_impl.super__Rb_tree_header);
    while( true ) {
      field = (FieldDef *)
              std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::end
                        ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                          *)&namespace_code_local[5]._M_t._M_impl.super__Rb_tree_header);
      bVar1 = __gnu_cxx::operator!=
                        (&local_360,
                         (__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                          *)&field);
      if (!bVar1) break;
      ppFVar3 = __gnu_cxx::
                __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                ::operator*(&local_360);
      pFStack_370 = *ppFVar3;
      if ((pFStack_370->deprecated & 1U) == 0) {
        local_380._M_current =
             (FieldDef **)
             std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::begin
                       ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *
                        )&namespace_code_local[5]._M_t._M_impl.super__Rb_tree_header);
        dVar4 = __gnu_cxx::operator-(&local_360,&local_380);
        local_374 = (int)dVar4;
        local_398 = pFStack_370;
        pVar5 = std::make_pair<int&,flatbuffers::FieldDef*>(&local_374,&local_398);
        local_390.second = pVar5.second;
        local_390.first = pVar5.first;
        std::
        vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
        ::push_back((vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
                     *)&it,&local_390);
      }
      __gnu_cxx::
      __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
      ::operator++(&local_360);
    }
    GenImplementationGetters
              (this,(StructDef *)namespace_code_local,
               (vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
                *)&it,local_28);
    if (((((this->super_BaseGenerator).parser_)->opts).generate_object_based_api & 1U) != 0) {
      GenStructObjectAPIUnpack_abi_cxx11_
                (&local_3d8,this,(StructDef *)namespace_code_local,
                 (vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
                  *)&it);
      std::operator+(&local_3b8,"\n",&local_3d8);
      std::__cxx11::string::operator+=((string *)local_28,(string *)&local_3b8);
      std::__cxx11::string::~string((string *)&local_3b8);
      std::__cxx11::string::~string((string *)&local_3d8);
      IdlNamer::ObjectType_abi_cxx11_(&local_438,&this->namer_,(StructDef *)namespace_code_local);
      std::operator+(&local_418,"\n  static int pack(fb.Builder fbBuilder, ",&local_438);
      std::operator+(&local_3f8,&local_418,"? object) {\n");
      std::__cxx11::string::operator+=((string *)local_28,(string *)&local_3f8);
      std::__cxx11::string::~string((string *)&local_3f8);
      std::__cxx11::string::~string((string *)&local_418);
      std::__cxx11::string::~string((string *)&local_438);
      std::__cxx11::string::operator+=((string *)local_28,"    if (object == null) return 0;\n");
      std::__cxx11::string::operator+=((string *)local_28,"    return object.pack(fbBuilder);\n");
      std::__cxx11::string::operator+=((string *)local_28,"  }\n");
    }
    std::__cxx11::string::operator+=((string *)local_28,"}\n\n");
    if (((((this->super_BaseGenerator).parser_)->opts).generate_object_based_api & 1U) != 0) {
      GenStructObjectAPI_abi_cxx11_
                (&local_458,this,(StructDef *)namespace_code_local,
                 (vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
                  *)&it);
      std::__cxx11::string::operator+=((string *)local_28,(string *)&local_458);
      std::__cxx11::string::~string((string *)&local_458);
    }
    GenReader(this,(StructDef *)namespace_code_local,(string *)local_a0,
              (string *)((long)&builder_code.field_2 + 8));
    GenBuilder(this,(StructDef *)namespace_code_local,
               (vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
                *)&it,(string *)((long)&object_builder_name.field_2 + 8),(string *)local_140);
    GenObjectBuilder(this,(StructDef *)namespace_code_local,
                     (vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
                      *)&it,(string *)((long)&reader_code.field_2 + 8),(string *)local_140);
    std::__cxx11::string::operator+=
              ((string *)local_28,(string *)(builder_code.field_2._M_local_buf + 8));
    std::__cxx11::string::operator+=((string *)local_28,(string *)local_140);
    std::
    vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
    ::~vector((vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
               *)&it);
    std::__cxx11::string::~string((string *)local_140);
    std::__cxx11::string::~string((string *)(builder_code.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(reader_code.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(object_builder_name.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_a0);
    std::__cxx11::string::~string((string *)(reader_name.field_2._M_local_buf + 8));
  }
  return;
}

Assistant:

void GenStruct(const StructDef &struct_def,
                 namespace_code_map &namespace_code) {
    if (struct_def.generated) return;

    std::string &code =
        namespace_code[namer_.Namespace(*struct_def.defined_namespace)];

    const auto &struct_type = namer_.Type(struct_def);

    // Emit constructor

    GenDocComment(struct_def.doc_comment, "", code);

    auto reader_name = "_" + struct_type + "Reader";
    auto builder_name = struct_type + "Builder";
    auto object_builder_name = struct_type + "ObjectBuilder";

    std::string reader_code, builder_code;

    code += "class " + struct_type + " {\n";

    code += "  " + struct_type + "._(this._bc, this._bcOffset);\n";
    if (!struct_def.fixed) {
      code += "  factory " + struct_type + "(List<int> bytes) {\n";
      code +=
          "    final rootRef = " + _kFb + ".BufferContext.fromBytes(bytes);\n";
      code += "    return reader.read(rootRef, 0);\n";
      code += "  }\n";
    }

    code += "\n";
    code += "  static const " + _kFb + ".Reader<" + struct_type +
            "> reader = " + reader_name + "();\n\n";

    code += "  final " + _kFb + ".BufferContext _bc;\n";
    code += "  final int _bcOffset;\n\n";

    std::vector<std::pair<int, FieldDef *>> non_deprecated_fields;
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      FieldDef &field = **it;
      if (field.deprecated) continue;
      auto offset = static_cast<int>(it - struct_def.fields.vec.begin());
      non_deprecated_fields.push_back(std::make_pair(offset, &field));
    }

    GenImplementationGetters(struct_def, non_deprecated_fields, code);

    if (parser_.opts.generate_object_based_api) {
      code +=
          "\n" + GenStructObjectAPIUnpack(struct_def, non_deprecated_fields);

      code += "\n  static int pack(fb.Builder fbBuilder, " +
              namer_.ObjectType(struct_def) + "? object) {\n";
      code += "    if (object == null) return 0;\n";
      code += "    return object.pack(fbBuilder);\n";
      code += "  }\n";
    }

    code += "}\n\n";

    if (parser_.opts.generate_object_based_api) {
      code += GenStructObjectAPI(struct_def, non_deprecated_fields);
    }

    GenReader(struct_def, reader_name, reader_code);
    GenBuilder(struct_def, non_deprecated_fields, builder_name, builder_code);
    GenObjectBuilder(struct_def, non_deprecated_fields, object_builder_name,
                     builder_code);

    code += reader_code;
    code += builder_code;
  }